

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader_factory.cc
# Opt level: O0

bool draco::FileReaderFactory::RegisterReader(OpenFunction open_function)

{
  vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *this;
  size_type sVar1;
  size_type sVar2;
  vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *in_RDI;
  size_t num_readers;
  vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *open_functions;
  undefined1 local_1;
  
  if (in_RDI == (vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                 *)0x0) {
    local_1 = false;
  }
  else {
    this = (anonymous_namespace)::GetFileReaderOpenFunctions_abi_cxx11_();
    sVar1 = std::
            vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            ::size(this);
    std::
    vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::push_back(in_RDI,(value_type *)this);
    sVar2 = std::
            vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            ::size(this);
    local_1 = sVar2 == sVar1 + 1;
  }
  return local_1;
}

Assistant:

bool FileReaderFactory::RegisterReader(OpenFunction open_function) {
  if (open_function == nullptr) {
    return false;
  }
  auto open_functions = GetFileReaderOpenFunctions();
  const size_t num_readers = open_functions->size();
  open_functions->push_back(open_function);
  return open_functions->size() == num_readers + 1;
}